

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Skip(ConcatenatingInputStream *this,int count)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ZeroCopyInputStream **ppZVar4;
  undefined4 extraout_var;
  long lVar5;
  char cVar6;
  long lVar7;
  undefined4 extraout_var_00;
  
  if (0 < this->stream_count_) {
    ppZVar4 = this->streams_;
    do {
      iVar2 = (*(*ppZVar4)->_vptr_ZeroCopyInputStream[5])();
      iVar3 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[4])(*this->streams_,(ulong)(uint)count)
      ;
      if ((char)iVar3 != '\0') {
        return (bool)(char)iVar3;
      }
      lVar7 = CONCAT44(extraout_var,iVar2) + (long)count;
      iVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
      lVar5 = CONCAT44(extraout_var_00,iVar2);
      if (lVar7 <= lVar5) {
        Skip();
        cVar6 = (char)*(undefined8 *)(lVar5 + 0x18);
        if (*(int *)(lVar5 + 0x10) != 0) {
          cVar1 = (**(code **)(*(long *)**(undefined8 **)(lVar5 + 8) + 0x28))();
          cVar6 = cVar6 + cVar1;
        }
        return (bool)cVar6;
      }
      count = (int)lVar7 - iVar2;
      this->bytes_retired_ = this->bytes_retired_ + lVar5;
      ppZVar4 = this->streams_ + 1;
      this->streams_ = ppZVar4;
      iVar2 = this->stream_count_;
      this->stream_count_ = iVar2 + -1;
    } while (1 < iVar2);
  }
  return false;
}

Assistant:

bool ConcatenatingInputStream::Skip(int count) {
  while (stream_count_ > 0) {
    // Assume that ByteCount() can be used to find out how much we actually
    // skipped when Skip() fails.
    int64_t target_byte_count = streams_[0]->ByteCount() + count;
    if (streams_[0]->Skip(count)) return true;

    // Hit the end of the stream.  Figure out how many more bytes we still have
    // to skip.
    int64_t final_byte_count = streams_[0]->ByteCount();
    ABSL_DCHECK_LT(final_byte_count, target_byte_count);
    count = target_byte_count - final_byte_count;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += final_byte_count;
    ++streams_;
    --stream_count_;
  }

  return false;
}